

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QSslCertificate>::copyAppend
          (QGenericArrayOps<QSslCertificate> *this,QSslCertificate *b,QSslCertificate *e)

{
  QSslCertificate *pQVar1;
  QSslCertificate *in_RDX;
  QSslCertificate *in_RSI;
  long in_RDI;
  QSslCertificate *data;
  QSslCertificate *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar1 = QArrayDataPointer<QSslCertificate>::begin
                       ((QArrayDataPointer<QSslCertificate> *)0x114947);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QSslCertificate::QSslCertificate(pQVar1 + *(long *)(in_RDI + 0x10),local_10);
      local_10 = local_10 + 8;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }